

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O2

void __thiscall
unibn::Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_>::clear
          (Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *this)

{
  Octant *this_00;
  _Vector_base<Point3f,_std::allocator<Point3f>_> *this_01;
  pointer puVar1;
  
  this_00 = this->root_;
  if (this_00 != (Octant *)0x0) {
    Octant::~Octant(this_00);
  }
  operator_delete(this_00,0x60);
  if ((this->params_).copyPoints == true) {
    this_01 = &this->data_->super__Vector_base<Point3f,_std::allocator<Point3f>_>;
    if (this_01 != (_Vector_base<Point3f,_std::allocator<Point3f>_> *)0x0) {
      std::_Vector_base<Point3f,_std::allocator<Point3f>_>::~_Vector_base(this_01);
    }
    operator_delete(this_01,0x18);
  }
  this->root_ = (Octant *)0x0;
  this->data_ = (vector<Point3f,_std::allocator<Point3f>_> *)0x0;
  puVar1 = (this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void Octree<PointT, ContainerT>::clear()
{
  delete root_;
  if (params_.copyPoints) delete data_;
  root_ = 0;
  data_ = 0;
  successors_.clear();
}